

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Symbol * __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::makeSymbol<int>
          (Symbol *__return_storage_ptr__,PrecisionCase *this,Variable<int> *variable)

{
  VarType local_58;
  string local_40;
  Variable<int> *local_20;
  Variable<int> *variable_local;
  PrecisionCase *this_local;
  
  local_20 = variable;
  variable_local = (Variable<int> *)this;
  this_local = (PrecisionCase *)__return_storage_ptr__;
  Variable<int>::getName_abi_cxx11_(&local_40,variable);
  getVarTypeOf<int>(&local_58,(this->m_ctx).precision);
  ShaderExecUtil::Symbol::Symbol(__return_storage_ptr__,&local_40,&local_58);
  glu::VarType::~VarType(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Symbol				makeSymbol		(const Variable<T>& variable)
	{
		return Symbol(variable.getName(), getVarTypeOf<T>(m_ctx.precision));
	}